

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void nn_random_generate(void *buf,size_t len)

{
  ulong in_RSI;
  void *in_RDI;
  uint8_t *pos;
  size_t local_28;
  void *local_18;
  ulong local_10;
  
  local_18 = in_RDI;
  local_10 = in_RSI;
  while( true ) {
    nn_random_state = nn_random_state * 0x41c64e6d + 0x3039;
    if (local_10 < 9) {
      local_28 = local_10;
    }
    else {
      local_28 = 8;
    }
    memcpy(local_18,&nn_random_state,local_28);
    if (local_10 < 9) break;
    local_10 = local_10 - 8;
    local_18 = (void *)((long)local_18 + 8);
  }
  return;
}

Assistant:

void nn_random_generate (void *buf, size_t len)
{
    uint8_t *pos;

    pos = (uint8_t*) buf;

    while (1) {

        /*  Generate a pseudo-random integer. */
        nn_random_state = nn_random_state * 1103515245 + 12345;

        /*  Move the bytes to the output buffer. */
        memcpy (pos, &nn_random_state, len > 8 ? 8 : len);
        if (nn_fast (len <= 8))
            return;
        len -= 8;
        pos += 8;
    }
}